

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O3

bool __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Eval
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          Stack<rapidjson::CrtAllocator> *operandStack,Operator op)

{
  SizeType SVar1;
  SizeType l1;
  char *pcVar2;
  SizeType SVar3;
  State *pSVar4;
  Frag *pFVar5;
  uint uVar6;
  uint uVar7;
  SizeType SVar8;
  
  switch(op) {
  case kZeroOrOne:
    pcVar2 = operandStack->stackTop_;
    if ((ulong)((long)pcVar2 - (long)operandStack->stack_) < 0xc) {
      return false;
    }
    operandStack->stackTop_ = pcVar2 + -0xc;
    SVar8 = *(SizeType *)(pcVar2 + -0xc);
    SVar3 = *(SizeType *)(pcVar2 + -8);
    uVar7 = *(uint *)(pcVar2 + -4);
    pSVar4 = Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                       (&this->states_,1);
    pSVar4->out = 0xffffffff;
    pSVar4->out1 = SVar8;
    pSVar4->rangeStart = 0xffffffff;
    pSVar4->codepoint = 0;
    SVar8 = this->stateCount_;
    this->stateCount_ = SVar8 + 1;
    SVar3 = Append(this,SVar3,SVar8);
    break;
  case kZeroOrMore:
    pcVar2 = operandStack->stackTop_;
    if ((ulong)((long)pcVar2 - (long)operandStack->stack_) < 0xc) {
      return false;
    }
    operandStack->stackTop_ = pcVar2 + -0xc;
    SVar8 = *(SizeType *)(pcVar2 + -0xc);
    SVar3 = *(SizeType *)(pcVar2 + -8);
    uVar7 = *(uint *)(pcVar2 + -4);
    pSVar4 = Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                       (&this->states_,1);
    pSVar4->out = 0xffffffff;
    pSVar4->out1 = SVar8;
    pSVar4->rangeStart = 0xffffffff;
    pSVar4->codepoint = 0;
    SVar8 = this->stateCount_;
    this->stateCount_ = SVar8 + 1;
    Patch(this,SVar3,SVar8);
    SVar3 = SVar8;
    break;
  case kOneOrMore:
    pcVar2 = operandStack->stackTop_;
    if ((ulong)((long)pcVar2 - (long)operandStack->stack_) < 0xc) {
      return false;
    }
    operandStack->stackTop_ = pcVar2 + -0xc;
    SVar8 = *(SizeType *)(pcVar2 + -0xc);
    SVar1 = *(SizeType *)(pcVar2 + -8);
    uVar7 = *(uint *)(pcVar2 + -4);
    pSVar4 = Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                       (&this->states_,1);
    pSVar4->out = 0xffffffff;
    pSVar4->out1 = SVar8;
    pSVar4->rangeStart = 0xffffffff;
    pSVar4->codepoint = 0;
    SVar3 = this->stateCount_;
    this->stateCount_ = SVar3 + 1;
    Patch(this,SVar1,SVar3);
    break;
  case kConcatenation:
    pcVar2 = operandStack->stackTop_;
    if ((ulong)((long)pcVar2 - (long)operandStack->stack_) < 0x18) {
      __assert_fail("operandStack.GetSize() >= sizeof(Frag) * 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                    ,0x165,
                    "bool rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::Eval(Stack<Allocator> &, Operator) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                   );
    }
    operandStack->stackTop_ = pcVar2 + -0xc;
    if ((ulong)((long)(pcVar2 + -0xc) - (long)operandStack->stack_) < 0xc) {
LAB_00123d71:
      __assert_fail("GetSize() >= count * sizeof(T)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/stack.h"
                    ,0x8b,
                    "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::Pop(size_t) [Allocator = rapidjson::CrtAllocator, T = rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::Frag]"
                   );
    }
    uVar7 = *(uint *)(pcVar2 + -4);
    SVar1 = *(SizeType *)(pcVar2 + -0xc);
    SVar3 = *(SizeType *)(pcVar2 + -8);
    operandStack->stackTop_ = pcVar2 + -0x18;
    SVar8 = *(SizeType *)(pcVar2 + -0x18);
    uVar6 = *(uint *)(pcVar2 + -0x10);
    Patch(this,*(SizeType *)(pcVar2 + -0x14),SVar1);
    goto LAB_00123cda;
  case kAlternation:
    pcVar2 = operandStack->stackTop_;
    if ((ulong)((long)pcVar2 - (long)operandStack->stack_) < 0x18) {
      return false;
    }
    operandStack->stackTop_ = pcVar2 + -0xc;
    if ((ulong)((long)(pcVar2 + -0xc) - (long)operandStack->stack_) < 0xc) goto LAB_00123d71;
    uVar7 = *(uint *)(pcVar2 + -4);
    SVar8 = *(SizeType *)(pcVar2 + -0xc);
    SVar3 = *(SizeType *)(pcVar2 + -8);
    operandStack->stackTop_ = pcVar2 + -0x18;
    SVar1 = *(SizeType *)(pcVar2 + -0x18);
    l1 = *(SizeType *)(pcVar2 + -0x14);
    uVar6 = *(uint *)(pcVar2 + -0x10);
    pSVar4 = Stack<rapidjson::CrtAllocator>::
             Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::State>
                       (&this->states_,1);
    pSVar4->out = SVar1;
    pSVar4->out1 = SVar8;
    pSVar4->rangeStart = 0xffffffff;
    pSVar4->codepoint = 0;
    SVar8 = this->stateCount_;
    this->stateCount_ = SVar8 + 1;
    SVar3 = Append(this,l1,SVar3);
LAB_00123cda:
    if (uVar6 < uVar7) {
      uVar7 = uVar6;
    }
    break;
  default:
    return false;
  }
  pFVar5 = Stack<rapidjson::CrtAllocator>::
           Push<rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::Frag>
                     (operandStack,1);
  pFVar5->start = SVar8;
  pFVar5->out = SVar3;
  pFVar5->minIndex = uVar7;
  return true;
}

Assistant:

bool Eval(Stack<Allocator>& operandStack, Operator op) {
        switch (op) {
            case kConcatenation:
                RAPIDJSON_ASSERT(operandStack.GetSize() >= sizeof(Frag) * 2);
                {
                    Frag e2 = *operandStack.template Pop<Frag>(1);
                    Frag e1 = *operandStack.template Pop<Frag>(1);
                    Patch(e1.out, e2.start);
                    *operandStack.template Push<Frag>() = Frag(e1.start, e2.out, Min(e1.minIndex, e2.minIndex));
                }
                return true;

            case kAlternation:
                if (operandStack.GetSize() >= sizeof(Frag) * 2) {
                    Frag e2 = *operandStack.template Pop<Frag>(1);
                    Frag e1 = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(e1.start, e2.start, 0);
                    *operandStack.template Push<Frag>() = Frag(s, Append(e1.out, e2.out), Min(e1.minIndex, e2.minIndex));
                    return true;
                }
                return false;

            case kZeroOrOne:
                if (operandStack.GetSize() >= sizeof(Frag)) {
                    Frag e = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(kRegexInvalidState, e.start, 0);
                    *operandStack.template Push<Frag>() = Frag(s, Append(e.out, s), e.minIndex);
                    return true;
                }
                return false;

            case kZeroOrMore:
                if (operandStack.GetSize() >= sizeof(Frag)) {
                    Frag e = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(kRegexInvalidState, e.start, 0);
                    Patch(e.out, s);
                    *operandStack.template Push<Frag>() = Frag(s, s, e.minIndex);
                    return true;
                }
                return false;

            case kOneOrMore:
                if (operandStack.GetSize() >= sizeof(Frag)) {
                    Frag e = *operandStack.template Pop<Frag>(1);
                    SizeType s = NewState(kRegexInvalidState, e.start, 0);
                    Patch(e.out, s);
                    *operandStack.template Push<Frag>() = Frag(e.start, s, e.minIndex);
                    return true;
                }
                return false;

            default: 
                // syntax error (e.g. unclosed kLeftParenthesis)
                return false;
        }
    }